

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::checkForCustomUnit(string *unit_string)

{
  precise_unit pVar1;
  bool bVar2;
  const_reference pvVar3;
  size_type sVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  precise_unit pVar5;
  size_t custcode;
  uint32_t hcode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> csub;
  bool index;
  size_t loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  uint32_t commodity_code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe28;
  allocator<char> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  byte in_stack_fffffffffffffe57;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d1;
  allocator<char> local_a9 [40];
  allocator<char> local_81 [56];
  allocator<char> local_49 [40];
  byte local_21;
  long local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  double local_10;
  undefined8 local_8;
  
  local_20 = -1;
  local_21 = 0;
  local_18 = in_RDI;
  pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           front(in_stack_fffffffffffffe10);
  if ((*pvVar3 == '[') &&
     (pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::back(in_stack_fffffffffffffe10), *pvVar3 == ']')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               (char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    bVar2 = ends_with((string *)in_stack_fffffffffffffe20._M_current,in_stack_fffffffffffffe18);
    std::__cxx11::string::~string(in_stack_fffffffffffffe10);
    std::allocator<char>::~allocator(local_49);
    if (bVar2) {
      sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(local_18);
      local_20 = sVar4 - 2;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 (char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      bVar2 = ends_with((string *)in_stack_fffffffffffffe20._M_current,in_stack_fffffffffffffe18);
      std::__cxx11::string::~string(in_stack_fffffffffffffe10);
      std::allocator<char>::~allocator(local_81);
      if (bVar2) {
        sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(local_18);
        local_20 = sVar4 - 6;
        local_21 = 1;
      }
    }
  }
  else {
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             front(in_stack_fffffffffffffe10);
    if ((*pvVar3 == '{') &&
       (pvVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                           (in_stack_fffffffffffffe10), *pvVar3 == '}')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 (char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      in_stack_fffffffffffffe57 =
           ends_with((string *)in_stack_fffffffffffffe20._M_current,in_stack_fffffffffffffe18);
      std::__cxx11::string::~string(in_stack_fffffffffffffe10);
      std::allocator<char>::~allocator(local_a9);
      if ((in_stack_fffffffffffffe57 & 1) == 0) {
        in_stack_fffffffffffffe48 = &local_d1;
        __a = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                   (char *)in_stack_fffffffffffffe48,(allocator<char> *)__a);
        bVar2 = ends_with((string *)in_stack_fffffffffffffe20._M_current,in_stack_fffffffffffffe18);
        std::__cxx11::string::~string(in_stack_fffffffffffffe10);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        if (bVar2) {
          sVar4 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(local_18);
          local_20 = sVar4 - 6;
          local_21 = 1;
        }
      }
      else {
        sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(local_18);
        local_20 = sVar4 - 3;
      }
    }
  }
  if (local_20 == -1) {
    local_10 = NAN;
    local_8 = 0xfa94a488;
  }
  else {
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
    if ((*pvVar3 == '\'') ||
       (pvVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08),
       *pvVar3 == '_')) {
      local_20 = local_20 + -1;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe28._M_current,(size_type)in_stack_fffffffffffffe20._M_current,
               (size_type)in_stack_fffffffffffffe18);
    if ((local_21 & 1) == 0) {
      __result._M_current = (char *)&local_f8;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                (in_stack_fffffffffffffe08);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __result._M_current);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                (in_stack_fffffffffffffe08);
      this = std::
             transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                       (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,__result,
                        (_func_int_int *)in_stack_fffffffffffffe10);
      CLI::std::
      hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this._M_current,(string *)__result._M_current);
      pVar5 = precise::generate_custom_unit(0);
      local_10 = pVar5.multiplier_;
    }
    else {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48);
      commodity_code = (uint32_t)((ulong)in_stack_fffffffffffffe08 >> 0x20);
      getCommodity((string *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      std::__cxx11::string::~string(in_stack_fffffffffffffe10);
      precise::generate_custom_count_unit(0);
      precise_unit::precise_unit
                ((precise_unit *)in_stack_fffffffffffffe20._M_current,
                 (double)in_stack_fffffffffffffe18,(precise_unit *)in_stack_fffffffffffffe10,
                 commodity_code);
      pVar5.base_units_ = (unit_data)(undefined4)local_8;
      pVar5.commodity_ = local_8._4_4_;
      pVar5.multiplier_ = (double)in_stack_fffffffffffffe10;
    }
    local_8 = pVar5._8_8_;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               pVar5.multiplier_);
  }
  pVar1.base_units_ = (unit_data)(undefined4)local_8;
  pVar1.commodity_ = local_8._4_4_;
  pVar1.multiplier_ = local_10;
  return pVar1;
}

Assistant:

static precise_unit checkForCustomUnit(const std::string& unit_string)
{
    size_t loc = std::string::npos;
    bool index = false;
    if (unit_string.front() == '[' && unit_string.back() == ']') {
        if (ends_with(unit_string, "U]")) {
            loc = unit_string.size() - 2;
        } else if (ends_with(unit_string, "index]")) {
            loc = unit_string.size() - 6;
            index = true;
        }
    } else if (unit_string.front() == '{' && unit_string.back() == '}') {
        if (ends_with(unit_string, "'u}")) {
            loc = unit_string.size() - 3;
        } else if (ends_with(unit_string, "index}")) {
            loc = unit_string.size() - 6;
            index = true;
        }
    }
    if (loc != std::string::npos) {
        if ((unit_string[loc - 1] == '\'') || (unit_string[loc - 1] == '_')) {
            --loc;
        }
        auto csub = unit_string.substr(1, loc - 1);

        if (index) {
            auto hcode = getCommodity(csub);
            return {1.0, precise::generate_custom_count_unit(0), hcode};
        }

        std::transform(csub.begin(), csub.end(), csub.begin(), ::tolower);
        auto custcode = std::hash<std::string>{}(csub);
        return precise::generate_custom_unit(custcode & 0x3FU);
    }

    return precise::invalid;
}